

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O1

void VariableDeclaration_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsAstNode *pJVar1;
  void *pvVar2;
  undefined1 local_50 [8];
  JsValue r3;
  JsValue r2;
  
  pJVar1 = (JsAstNode *)na[1].location;
  if (pJVar1 == (JsAstNode *)0x0) {
    r3.u.completion.type = JS_COMPLETION_NORMAL;
  }
  else {
    (*JsNodeClassEval[pJVar1->astClass])(pJVar1,context,(JsValue *)((long)&r3.u + 8));
  }
  JsGetValue((JsValue *)((long)&r3.u + 8),(JsValue *)local_50);
  pvVar2 = JsListGet(context->scope,-1);
  (**(code **)((long)pvVar2 + 0x28))
            (pvVar2,*(undefined8 *)(na + 1),(JsValue *)local_50,context->varattr);
  return;
}

Assistant:

static void
VariableDeclaration_eval(na, context, res)
	struct JsAstNode *na; /* (struct VariableDeclaration_node) */
	struct JsContext *context;
	struct JsValue *res;		/* unused */
{
	struct JsAstVariableDeclarationNode *n = 
		CAST_NODE(na, JsAstVariableDeclarationNode);
	struct JsValue r2, r3;
	/*
		遇到
		var a;
		var a = 1;
		function a(){
		
		};
		的时候, 直接在当前scope中添加a = undefined; ...
	*/
	if (n->init) {
		EVAL(n->init, context, &r2);
	}else{
		//var a; 类型
		r2.type = JS_UNDEFINED;
	}
	JsGetValue(&r2, &r3);
	//直接添加到当前Scope中
	struct JsObject* top = (struct JsObject*)JsListGet(context->scope,JS_LIST_END);
	(*top->Put)(top,n->var,&r3,context->varattr);
}